

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest9::iterate(NegativeTest9 *this)

{
  Functions *gl_00;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar4;
  _test_case local_2c4;
  string local_2c0;
  MessageBuilder local_2a0;
  uint local_120;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  _test_case local_7c;
  undefined1 local_78 [8];
  string vs_body;
  int test_case;
  allocator<char> local_39;
  string local_38;
  Functions *local_18;
  Functions *gl;
  NegativeTest9 *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = (Functions *)CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (bVar1) {
    for (vs_body.field_2._12_4_ = 0; vs_body.field_2._12_4_ != 3;
        vs_body.field_2._12_4_ = vs_body.field_2._12_4_ + 1) {
      local_7c = vs_body.field_2._12_4_;
      getVertexShader_abi_cxx11_((string *)local_78,this,&local_7c);
      gl_00 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
      local_120 = 0;
      bVar1 = Utils::buildProgram(gl_00,(string *)local_78,&local_a0,&local_c8,&local_f0,&local_118,
                                  (GLchar **)0x0,&local_120,&this->m_vs_id,(GLuint *)0x0,
                                  (GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,&this->m_po_id);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      if (bVar1) {
        this_02 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_2a0,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_2a0,
                            (char (*) [46])"A program object was successfully built for [");
        local_2c4 = vs_body.field_2._12_4_;
        getTestCaseString_abi_cxx11_(&local_2c0,this,&local_2c4);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2c0);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [41])"] test case, even though it was invalid.");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_2c0);
        tcu::MessageBuilder::~MessageBuilder(&local_2a0);
        this->m_has_test_passed = false;
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
      std::__cxx11::string::~string((string *)local_78);
    }
    if ((this->m_has_test_passed & 1U) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_ARB_shader_subroutine is not supported.",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult NegativeTest9::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all test cases */
	for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT); ++test_case)
	{
		/* Try to build a program object using invalid vertex shader, specific to the
		 * iteration we're currently in */
		std::string vs_body = getVertexShader(static_cast<_test_case>(test_case));

		if (ShaderSubroutine::Utils::buildProgram(gl, vs_body, "",   /* tc_body */
												  "",				 /* te_body */
												  "",				 /* gs_body */
												  "",				 /* fs_body */
												  DE_NULL,			 /* xfb_varyings */
												  0,				 /* n_xfb_varyings */
												  &m_vs_id, DE_NULL, /* out_tc_id */
												  DE_NULL,			 /* out_te_id */
												  DE_NULL,			 /* out_gs_id */
												  DE_NULL,			 /* out_fs_id */
												  &m_po_id))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A program object was successfully built for ["
							   << getTestCaseString(static_cast<_test_case>(test_case))
							   << "] test case, even though it was invalid." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Delete any objects that may have been created */
		deinit();
	} /* for (all test cases) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}